

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_tests.cpp
# Opt level: O0

void __thiscall
test::spi_test::iu_SPITest_x_iutest_x_FatalFailure2_Test::Body
          (iu_SPITest_x_iutest_x_FatalFailure2_Test *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_210;
  Fixed local_1e0;
  int local_54;
  undefined1 local_50 [8];
  AssertionResult iutest_ar;
  int local_14;
  iu_SPITest_x_iutest_x_FatalFailure2_Test *piStack_10;
  int count;
  iu_SPITest_x_iutest_x_FatalFailure2_Test *this_local;
  
  local_14 = 0;
  piStack_10 = this;
  SPITest::FatalFailure2_Sub(&this->super_SPITest,&local_14);
  iutest::detail::AlwaysZero();
  local_54 = 1;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_50,"1","count",&local_54,&local_14);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    message = iutest::AssertionResult::message((AssertionResult *)local_50);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests.cpp"
               ,0xa0,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  return;
}

Assistant:

IUTEST_F(SPITest, FatalFailure2)
{
    int count=0;
#if IUTEST_HAS_EXCEPTIONS
    try {
        FatalFailure2_Sub(count);
    } catch(...) {
    }
#else
    FatalFailure2_Sub(count);
#endif
    IUTEST_ASSERT_EQ(1, count);
}